

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

void big_file_dtype_format(char *buffer,char *dtype,void *data,char *fmt)

{
  int iVar1;
  float local_c8;
  float fStack_c4;
  char converted [128];
  variant_t p;
  char ndtype2 [8];
  char ndtype [8];
  char *fmt_local;
  void *data_local;
  char *dtype_local;
  char *buffer_local;
  
  _dtype_normalize((char *)&p,dtype);
  p._0_1_ = 0x3d;
  _dtype_normalize(ndtype2,(char *)&p);
  dtype_convert_simple(&local_c8,ndtype2,data,dtype,1);
  iVar1 = strcmp(ndtype2 + 1,"a1");
  ndtype = (char  [8])fmt;
  if (iVar1 == 0) {
    if (fmt == (char *)0x0) {
      ndtype = (char  [8])anon_var_dwarf_660;
    }
    sprintf(buffer,(char *)ndtype,(ulong)(uint)(int)local_c8._0_1_);
  }
  else {
    iVar1 = strcmp(ndtype2 + 1,"b1");
    if (iVar1 == 0) {
      if (fmt == (char *)0x0) {
        ndtype = (char  [8])((long)" NMEMB: %d" + 8);
      }
      sprintf(buffer,(char *)ndtype,(ulong)(uint)(int)local_c8._0_1_);
    }
    else {
      iVar1 = strcmp(ndtype2 + 1,"i8");
      if (iVar1 == 0) {
        if (fmt == (char *)0x0) {
          ndtype = (char  [8])anon_var_dwarf_681;
        }
        sprintf(buffer,(char *)ndtype,CONCAT44(fStack_c4,local_c8));
      }
      else {
        iVar1 = strcmp(ndtype2 + 1,"i4");
        if (iVar1 == 0) {
          if (fmt == (char *)0x0) {
            ndtype = (char  [8])((long)" NMEMB: %d" + 8);
          }
          sprintf(buffer,(char *)ndtype,(ulong)(uint)local_c8);
        }
        else {
          iVar1 = strcmp(ndtype2 + 1,"u8");
          if (iVar1 == 0) {
            if (fmt == (char *)0x0) {
              ndtype = (char  [8])anon_var_dwarf_6ae;
            }
            sprintf(buffer,(char *)ndtype,CONCAT44(fStack_c4,local_c8));
          }
          else {
            iVar1 = strcmp(ndtype2 + 1,"u4");
            if (iVar1 == 0) {
              if (fmt == (char *)0x0) {
                ndtype = (char  [8])((long)" %06X: %td : %u : %u" + 0x12);
              }
              sprintf(buffer,(char *)ndtype,(ulong)(uint)local_c8);
            }
            else {
              iVar1 = strcmp(ndtype2 + 1,"f8");
              if (iVar1 == 0) {
                if (fmt == (char *)0x0) {
                  ndtype = (char  [8])anon_var_dwarf_6da;
                }
                sprintf(buffer,(char *)ndtype,CONCAT44(fStack_c4,local_c8));
              }
              else {
                iVar1 = strcmp(ndtype2 + 1,"f4");
                if (iVar1 == 0) {
                  if (fmt == (char *)0x0) {
                    ndtype = (char  [8])anon_var_dwarf_6da;
                  }
                  sprintf(buffer,(char *)ndtype,(double)local_c8);
                }
                else {
                  iVar1 = strcmp(ndtype2 + 1,"c8");
                  if (iVar1 == 0) {
                    if (fmt == (char *)0x0) {
                      ndtype = (char  [8])anon_var_dwarf_6fb;
                    }
                    sprintf(buffer,(char *)ndtype,(double)local_c8,(double)fStack_c4);
                  }
                  else {
                    iVar1 = strcmp(ndtype2 + 1,"c16");
                    if (iVar1 == 0) {
                      if (fmt == (char *)0x0) {
                        ndtype = (char  [8])anon_var_dwarf_6fb;
                      }
                      sprintf(buffer,(char *)ndtype,CONCAT44(fStack_c4,local_c8),converted._0_8_);
                    }
                    else {
                      sprintf(buffer,"<%s>",ndtype2);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
big_file_dtype_format(char * buffer, const char * dtype, const void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);
    dtype_convert_simple(converted, ndtype, data, dtype, 1);

    p.v = converted;
#define FORMAT1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, *p.dtype); \
    } else
#define FORMAT2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, p.dtype->r, p.dtype->i); \
    } else

    FORMAT1(a1, "%c")
    FORMAT1(b1, "%d")
    FORMAT1(i8, "%ld")
    FORMAT1(i4, "%d")
    FORMAT1(u8, "%lu")
    FORMAT1(u4, "%u")
    FORMAT1(f8, "%g")
    FORMAT1(f4, "%g")
    FORMAT2(c8, "%g+%gI")
    FORMAT2(c16, "%g+%gI")
    {
        sprintf(buffer, "<%s>", ndtype);
    }
}